

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ExtensionSet::SetRepeatedEnum
          (ExtensionSet *this,int number,int index,int value)

{
  Extension *pEVar1;
  Extension *extension;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  LogMessage *in_stack_fffffffffffffee0;
  LogLevel_conflict in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  ExtensionSet *in_stack_fffffffffffffef8;
  int *in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff9c;
  undefined7 in_stack_ffffffffffffffa0;
  byte bVar2;
  
  pEVar1 = FindOrNull(in_stack_fffffffffffffef8,in_stack_fffffffffffffef4);
  bVar2 = 0;
  if (pEVar1 == (Extension *)0x0) {
    LogMessage::LogMessage
              ((LogMessage *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               in_stack_fffffffffffffeec,(char *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc
              );
    bVar2 = 1;
    LogMessage::operator<<
              (in_stack_fffffffffffffee0,
               (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    LogMessage::operator<<
              (in_stack_fffffffffffffee0,
               (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    LogFinisher::operator=
              ((LogFinisher *)in_stack_fffffffffffffee0,
               (LogMessage *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  }
  if ((bVar2 & 1) != 0) {
    LogMessage::~LogMessage((LogMessage *)0x474c12);
  }
  RepeatedField<int>::Set
            ((RepeatedField<int> *)CONCAT17(bVar2,in_stack_ffffffffffffffa0),
             in_stack_ffffffffffffff9c,in_stack_ffffffffffffff90);
  return;
}

Assistant:

void ExtensionSet::SetRepeatedEnum(int number, int index, int value) {
  Extension* extension = FindOrNull(number);
  GOOGLE_CHECK(extension != NULL) << "Index out-of-bounds (field is empty).";
  GOOGLE_DCHECK_TYPE(*extension, REPEATED_FIELD, ENUM);
  extension->repeated_enum_value->Set(index, value);
}